

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void __thiscall Context<false>::Context(Context<false> *this)

{
  LabelObjectState<false> *in_RDI;
  
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI);
  std::vector<Namespace<false>,_std::allocator<Namespace<false>_>_>::vector
            ((vector<Namespace<false>,_std::allocator<Namespace<false>_>_> *)0x270243);
  DefaultState<false>::DefaultState((DefaultState<false> *)in_RDI);
  LabelState<false>::LabelState((LabelState<false> *)in_RDI);
  LabelObjectState<false>::LabelObjectState(in_RDI);
  LabelSinglePropertyState<false>::LabelSinglePropertyState
            ((LabelSinglePropertyState<false> *)in_RDI);
  LabelIndexState<false>::LabelIndexState((LabelIndexState<false> *)in_RDI);
  TextState<false>::TextState((TextState<false> *)in_RDI);
  TagState<false>::TagState((TagState<false> *)in_RDI);
  MultiState<false>::MultiState((MultiState<false> *)in_RDI);
  IgnoreState<false>::IgnoreState((IgnoreState<false> *)in_RDI);
  ArrayState<false>::ArrayState((ArrayState<false> *)in_RDI);
  DecisionServiceState<false>::DecisionServiceState((DecisionServiceState<false> *)in_RDI);
  ArrayToVectorState<false,_float>::ArrayToVectorState((ArrayToVectorState<false,_float> *)in_RDI);
  ArrayToVectorState<false,_unsigned_int>::ArrayToVectorState
            ((ArrayToVectorState<false,_unsigned_int> *)in_RDI);
  StringToStringState<false>::StringToStringState((StringToStringState<false> *)in_RDI);
  FloatToFloatState<false>::FloatToFloatState((FloatToFloatState<false> *)in_RDI);
  BoolToBoolState<false>::BoolToBoolState((BoolToBoolState<false> *)in_RDI);
  *(cb_class **)&(in_RDI->cb_label).probability = &in_RDI[2].cb_label;
  *(cb_class **)&in_RDI[9].found = &in_RDI[2].cb_label;
  return;
}

Assistant:

Context()
  {
    current_state = &default_state;
    root_state = &default_state;
  }